

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O1

void __thiscall camp::UserObject::set(UserObject *this,Property *property,Value *value)

{
  NullObject *__return_storage_ptr__;
  ParentObject *this_00;
  string local_b0;
  string local_90;
  NullObject local_70;
  
  if ((this->m_holder).
      super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*(property->super_TagHolder)._vptr_TagHolder[4])(property,this,value);
    return;
  }
  if ((this->m_parent).px != (ParentObject *)0x0) {
    do {
      this_00 = (ParentObject *)this;
      this = &((scoped_ptr<camp::ParentObject> *)((long)&this_00->object + 0x18))->px->object;
      if ((ParentObject *)this == (ParentObject *)0x0) {
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/scoped_ptr.hpp",0x69,
                      "T *boost::scoped_ptr<camp::ParentObject>::operator->() const [T = camp::ParentObject]"
                     );
      }
    } while ((((ParentObject *)this)->object).m_parent.px != (ParentObject *)0x0);
    cascadeSet(&this_00->object,this,property,value);
    return;
  }
  __return_storage_ptr__ = (NullObject *)__cxa_allocate_exception(0x48);
  NullObject::NullObject(&local_70,this->m_class);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/userobject.cpp"
             ,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"void camp::UserObject::set(const Property &, const Value &) const"
             ,"");
  Error::prepare<camp::NullObject>(__return_storage_ptr__,&local_70,&local_90,0xd7,&local_b0);
  __cxa_throw(__return_storage_ptr__,&NullObject::typeinfo,Error::~Error);
}

Assistant:

void UserObject::set(const Property& property, const Value& value) const
{
    if (m_holder)
    {
        // Just forward to the property, no extra processing required
        property.setValue(*this, value);
    }
    else if (m_parent)
    {
        // Find the root object
        const UserObject* root = this;
        while (root->m_parent->object.m_parent)
            root = &root->m_parent->object;

        // Launch the recursive process
        root->cascadeSet(root->m_parent->object, property, value);
    }
    else
    {
        // Error, null object
        CAMP_ERROR(NullObject(m_class));
    }
}